

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QIBusPropTypeContentType qvariant_cast<QIBusPropTypeContentType>(QVariant *v)

{
  bool bVar1;
  int iVar2;
  QMetaType QVar3;
  QIBusPropTypeContentType *pQVar4;
  QMetaType QVar5;
  void *pvVar6;
  QIBusPropTypeContentType *in_RDI;
  long in_FS_OFFSET;
  QMetaType targetType;
  QIBusPropTypeContentType t;
  QMetaType *in_stack_ffffffffffffffb8;
  Private *in_stack_ffffffffffffffc0;
  QIBusPropTypeContentType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3 = QMetaType::fromType<QIBusPropTypeContentType>();
  QVariant::Private::type(in_stack_ffffffffffffffc0);
  bVar1 = operator==((QMetaType *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    if (((ulong)in_RDI[3] & 1) == 0) {
      local_10 = *in_RDI;
    }
    else {
      iVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x116e37);
      if (iVar2 == 1) {
        pQVar4 = (QIBusPropTypeContentType *)QVariant::PrivateShared::data((PrivateShared *)*in_RDI)
        ;
        local_10 = *pQVar4;
      }
      else {
        pQVar4 = QVariant::Private::get<QIBusPropTypeContentType>((Private *)0x116e5d);
        local_10 = *pQVar4;
      }
    }
  }
  else {
    local_10.purpose = 0xaaaaaaaa;
    local_10.hints = 0xaaaaaaaa;
    QIBusPropTypeContentType::QIBusPropTypeContentType(&local_10);
    QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    pvVar6 = QVariant::constData((QVariant *)0x116e96);
    QMetaType::convert(QVar5,pvVar6,QVar3,&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(QVariant &&v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType) {
        if (!v.d.is_shared) {
            return std::move(*reinterpret_cast<T *>(v.d.data.data));
        } else {
            if (v.d.data.shared->ref.loadRelaxed() == 1)
                return std::move(*reinterpret_cast<T *>(v.d.data.shared->data()));
            else
                return v.d.get<T>();
        }
    }
    if constexpr (std::is_same_v<T, QVariant>) {
        // if the metatype doesn't match, but we want a QVariant, just return the current variant
        return v;
    } if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        // moving a pointer is pointless, just do the same as the const & overload
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}